

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execChkCmp2<(moira::Core)2,(moira::Instr)145,(moira::Mode)7,1>(Moira *this,u16 opcode)

{
  byte bVar1;
  PrefetchQueue PVar2;
  u32 uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  u32 uVar8;
  int iVar9;
  bool bVar10;
  
  this->cp = 0;
  PVar2 = this->queue;
  uVar8 = (this->reg).pc + 2;
  (this->reg).pc = uVar8;
  uVar8 = read<(moira::Core)2,(moira::AddrSpace)2,2,0ull>(this,uVar8);
  (this->queue).irc = (u16)uVar8;
  uVar8 = computeEA<(moira::Core)2,(moira::Mode)7,1,0ull>(this,opcode & 7);
  uVar3 = read<(moira::Core)2,(moira::AddrSpace)1,1,0ull>(this,uVar8);
  uVar8 = read<(moira::Core)2,(moira::AddrSpace)1,1,0ull>(this,uVar8 + 1);
  uVar5 = (uint)(char)uVar3;
  uVar4 = (uint)(char)uVar8;
  bVar1 = *(byte *)((long)&(this->reg).field_3 + (ulong)((uint)PVar2 >> 10 & 0x3c));
  uVar6 = (int)(char)bVar1;
  if ((short)PVar2.irc < 0) {
    uVar6 = (uint)bVar1;
  }
  if ((int)uVar5 < (int)uVar4) {
    bVar10 = (int)uVar6 < (int)uVar5;
    bVar7 = (int)uVar4 < (int)uVar6;
  }
  else {
    bVar10 = (int)uVar4 < (int)uVar6;
    bVar7 = (int)uVar6 < (int)uVar5;
  }
  (this->reg).sr.c = (bool)(bVar7 | bVar10);
  (this->reg).sr.z = uVar6 == uVar4 || uVar6 == uVar5;
  if ((((uint)PVar2 >> 0xb & 1) == 0) || ((bool)(bVar7 | bVar10) == false)) {
    uVar8 = (this->reg).pc;
    (this->reg).pc0 = uVar8;
    (this->queue).ird = (this->queue).irc;
    uVar8 = read<(moira::Core)2,(moira::AddrSpace)2,2,4ull>(this,uVar8 + 2);
    (this->queue).irc = (u16)uVar8;
    this->readBuffer = (u16)uVar8;
    iVar9 = 0x16;
  }
  else {
    execException<(moira::Core)2>(this,CHK,0);
    iVar9 = 0x28;
  }
  (*this->_vptr_Moira[2])(this,(ulong)(uint)(iVar9 + this->cp));
  return;
}

Assistant:

void
Moira::execChkCmp2(u16 opcode)
{
    AVAILABILITY(Core::C68020)

    u32 ext = queue.irc;
    int src = _____________xxx(opcode);
    int dst = xxxx____________(ext);
    u32 ea, data1, data2;

    readExt<C>();

    readOp<C, M, S>(src, &ea, &data1);
    data2 = readM<C, M, S>(ea + S);

    if (MOIRA_MIMIC_MUSASHI) {

        auto bound1 = ((M == Mode(9) || M == Mode(10)) && S == Byte) ? (i32)data1 : SEXT<S>(data1);
        auto bound2 = ((M == Mode(9) || M == Mode(10)) && S == Byte) ? (i32)data2 : SEXT<S>(data2);
        i32 compare = readR<S>(dst);
        if (dst < 8) compare = SEXT<S>(compare);

        if (bound1 < bound2) {
            reg.sr.c = compare < bound1 || compare > bound2;
        } else {
            reg.sr.c = compare > bound2 || compare < bound1;
        }
        reg.sr.z = compare == bound1 || compare == bound2;

    } else {

        i32 bound1 = SEXT<S>(data1);
        i32 bound2 = SEXT<S>(data2);
        i32 compare = dst < 8 ? SEXT<S>(readR(dst)) : readR(dst);

        if (bound1 <= bound2) {
            reg.sr.c = compare < bound1 || compare > bound2;
        } else {
            reg.sr.c = compare < bound1 && compare > bound2;
        }
        reg.sr.z = compare == bound1 || compare == bound2;
        setUndefinedCHK2<C, S>(bound1, bound2, compare);
    }

    if ((ext & 0x800) && reg.sr.c) {

        execException<C>(M68kException::CHK);
        CYCLES_68020(40)

    } else {

        prefetch<C, POLL>();

        //           00  10  20        00  10  20        00  10  20
        //           .b  .b  .b        .w  .w  .w        .l  .l  .l
        CYCLES_AI   ( 0,  0, 22,        0,  0, 22,        0,  0, 22)
        CYCLES_DI   ( 0,  0, 23,        0,  0, 23,        0,  0, 23)
        CYCLES_IX   ( 0,  0, 25,        0,  0, 25,        0,  0, 25)
        CYCLES_AW   ( 0,  0, 22,        0,  0, 22,        0,  0, 22)
        CYCLES_AL   ( 0,  0, 22,        0,  0, 22,        0,  0, 22)
        CYCLES_DIPC ( 0,  0, 23,        0,  0, 23,        0,  0, 23)
        CYCLES_IXPC ( 0,  0, 23,        0,  0, 23,        0,  0, 23)
    }

    FINALIZE
}